

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O2

void __thiscall Dinic_Capacities_Test::TestBody(Dinic_Capacities_Test *this)

{
  int *piVar1;
  long lVar2;
  char *message;
  vector<int,_std::allocator<int>_> *e;
  undefined1 auVar3 [8];
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_09;
  undefined1 local_228 [8];
  Dinic d;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> local_1a0;
  vector<int,_std::allocator<int>_> local_188;
  vector<int,_std::allocator<int>_> local_170;
  vector<int,_std::allocator<int>_> local_158;
  vector<int,_std::allocator<int>_> local_140;
  vector<int,_std::allocator<int>_> local_128;
  vector<int,_std::allocator<int>_> local_110;
  vector<int,_std::allocator<int>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  int local_c8 [24];
  undefined1 local_68 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  edges;
  AssertHelper local_40;
  undefined4 local_38;
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  allocator_type local_30;
  allocator_type local_2f;
  allocator_type local_2e;
  allocator_type local_2d;
  allocator_type local_2c;
  allocator_type local_2b;
  allocator_type local_2a;
  allocator_type local_29;
  
  Dinic::Dinic((Dinic *)local_228,8);
  edges.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000000;
  __l._M_len = 3;
  __l._M_array = (iterator)
                 &edges.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l,&local_33);
  local_40.data_ = (AssertHelperData *)0x200000001;
  local_38 = 1;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_40;
  std::vector<int,_std::allocator<int>_>::vector(&local_1a0,__l_00,&local_32);
  local_c8[0] = 2;
  local_c8[1] = 3;
  local_c8[2] = 1;
  __l_01._M_len = 3;
  __l_01._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&local_188,__l_01,&local_31);
  local_c8[3] = 0;
  local_c8[4] = 4;
  local_c8[5] = 2;
  __l_02._M_len = 3;
  __l_02._M_array = local_c8 + 3;
  std::vector<int,_std::allocator<int>_>::vector(&local_170,__l_02,&local_30);
  local_c8[6] = 4;
  local_c8[7] = 5;
  local_c8[8] = 2;
  __l_03._M_len = 3;
  __l_03._M_array = local_c8 + 6;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_03,&local_2f);
  local_c8[9] = 5;
  local_c8[10] = 2;
  local_c8[0xb] = 2;
  __l_04._M_len = 3;
  __l_04._M_array = local_c8 + 9;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_04,&local_2e);
  local_c8[0xc] = 2;
  local_c8[0xd] = 1;
  local_c8[0xe] = 1;
  __l_05._M_len = 3;
  __l_05._M_array = local_c8 + 0xc;
  std::vector<int,_std::allocator<int>_>::vector(&local_128,__l_05,&local_2d);
  local_c8[0xf] = 1;
  local_c8[0x10] = 6;
  local_c8[0x11] = 2;
  __l_06._M_len = 3;
  __l_06._M_array = local_c8 + 0xf;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l_06,&local_2c);
  local_c8[0x12] = 6;
  local_c8[0x13] = 7;
  local_c8[0x14] = 2;
  __l_07._M_len = 3;
  __l_07._M_array = local_c8 + 0x12;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_07,&local_2b);
  local_c8[0x15] = 7;
  local_c8[0x16] = 3;
  local_c8[0x17] = 2;
  __l_08._M_len = 3;
  __l_08._M_array = local_c8 + 0x15;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_08,&local_2a);
  __l_09._M_len = 10;
  __l_09._M_array =
       (iterator)
       &d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_68,__l_09,&local_29);
  lVar2 = 0xd8;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  for (auVar3 = local_68;
      auVar3 != (undefined1  [8])
                edges.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar3 = (undefined1  [8])((long)auVar3 + 0x18)) {
    piVar1 = (((pointer)auVar3)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Dinic::addEdge((Dinic *)local_228,*piVar1,piVar1[1],(long)piVar1[2]);
  }
  edges.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)Dinic::getFlow((Dinic *)local_228,0,3);
  local_40.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<long_long,int>
            ((internal *)
             &d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,"d.getFlow(0, 3)","3",
             (longlong *)
             &edges.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(int *)&local_40);
  if ((char)d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage == '\0') {
    testing::Message::Message
              ((Message *)
               &edges.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/dinic_test.cpp"
               ,0x3a,message);
    testing::internal::AssertHelper::operator=
              (&local_40,
               (Message *)
               &edges.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&edges.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_68);
  Dinic::~Dinic((Dinic *)local_228);
  return;
}

Assistant:

TEST(Dinic, Capacities) {
    // We construct a graph where it is necessary to consider residual capacities
    Dinic d(8);
    vector<vector<int>> edges = {
        {0, 1, 1},
        {1, 2, 1},
        {2, 3, 1},
        {0, 4, 2},
        {4, 5, 2},
        {5, 2, 2},
        {2, 1, 1}, // the important reverse edge
        {1, 6, 2},
        {6, 7, 2},
        {7, 3, 2},
    };
    for (auto &e : edges) {
        d.addEdge(e[0], e[1], e[2]);
    }
    
    EXPECT_EQ(d.getFlow(0, 3), 3);
}